

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.h
# Opt level: O2

void __thiscall
bloomfilter::BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8>::BloomFilter
          (BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8> *this,size_t n)

{
  uint64_t *puVar1;
  ulong uVar2;
  
  hashing::SimpleMixSplit::SimpleMixSplit(&this->hasher);
  this->size = 0;
  this->kk = 8;
  this->bitCount = n * 0xc;
  uVar2 = n * 0xc + 0x3f >> 6;
  this->arrayLength = uVar2;
  puVar1 = (uint64_t *)operator_new__(uVar2 * 8);
  this->data = puVar1;
  std::__fill_n_a<unsigned_long*,unsigned_long,int>(puVar1,uVar2);
  return;
}

Assistant:

explicit BloomFilter(const size_t n) : hasher() {
    this->size = 0;
    this->kk = getBestK(bits_per_item);
    this->bitCount = n * bits_per_item;
    this->arrayLength = (bitCount + 63) / 64;
    data = new uint64_t[arrayLength];
    std::fill_n(data, arrayLength, 0);
  }